

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  time_t *ptVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  Curl_addrinfo *pCVar5;
  undefined8 *puVar6;
  pthread_mutex_t *__mutex;
  char *pcVar7;
  pthread_t *ppVar8;
  int *piVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Curl_async *async;
  int iVar12;
  curltime cVar13;
  char sbuf [12];
  char local_50 [16];
  int *local_40;
  Curl_easy *local_38;
  
  local_38 = conn->data;
  ptVar1 = (time_t *)(local_38->state).resolver;
  *waitp = 0;
  local_40 = waitp;
  iVar4 = inet_pton(2,hostname,local_50);
  if (0 < iVar4) {
    pCVar5 = Curl_ip2addr(2,local_50,hostname,port);
    return pCVar5;
  }
  iVar4 = inet_pton(10,hostname,local_50);
  if (0 < iVar4) {
    pCVar5 = Curl_ip2addr(10,local_50,hostname,port);
    return pCVar5;
  }
  if (conn->ip_version == 1) {
    bVar2 = true;
    uVar11 = 2;
  }
  else if (conn->ip_version == 2) {
    uVar11 = 10;
    bVar2 = false;
  }
  else {
    bVar2 = false;
    uVar11 = 0;
  }
  uVar10 = 2;
  if (!bVar2) {
    _Var3 = Curl_ipv6works();
    uVar10 = 2;
    if (_Var3) {
      uVar10 = uVar11;
    }
  }
  iVar4 = conn->socktype;
  curl_msnprintf(local_50,0xc,"%d");
  cVar13 = Curl_now();
  *ptVar1 = cVar13.tv_sec;
  *(int *)(ptVar1 + 1) = cVar13.tv_usec;
  puVar6 = (undefined8 *)(*Curl_ccalloc)(1,0x78);
  (conn->async).os_specific = puVar6;
  iVar12 = 0xc;
  if (puVar6 != (undefined8 *)0x0) {
    (conn->async).port = port;
    (conn->async).done = false;
    (conn->async).status = 0;
    (conn->async).dns = (Curl_dns_entry *)0x0;
    *puVar6 = 0;
    puVar6[0xd] = 0;
    puVar6[0xe] = 0;
    puVar6[5] = 0;
    puVar6[6] = 0;
    puVar6[3] = 0;
    puVar6[4] = 0;
    puVar6[7] = 0;
    puVar6[8] = 0;
    puVar6[9] = 0;
    puVar6[10] = 0;
    puVar6[0xb] = 0;
    puVar6[0xc] = 0;
    puVar6[0xe] = puVar6;
    *(int *)(puVar6 + 6) = port;
    *(undefined4 *)(puVar6 + 4) = 1;
    *(undefined4 *)(puVar6 + 8) = 0;
    *(undefined4 *)((long)puVar6 + 0x44) = uVar10;
    *(int *)(puVar6 + 9) = iVar4;
    *(undefined8 *)((long)puVar6 + 0x4c) = 0;
    *(undefined8 *)((long)puVar6 + 0x54) = 0;
    *(undefined8 *)((long)puVar6 + 0x5c) = 0;
    *(undefined8 *)((long)puVar6 + 100) = 0;
    *(undefined4 *)((long)puVar6 + 0x6c) = 0;
    __mutex = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
    puVar6[3] = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      *(undefined4 *)((long)puVar6 + 0x34) = 0;
      pcVar7 = (*Curl_cstrdup)(hostname);
      puVar6[5] = pcVar7;
      if (pcVar7 != (char *)0x0) {
        async = &conn->async;
        (*Curl_cfree)(async->hostname);
        pcVar7 = (*Curl_cstrdup)(hostname);
        async->hostname = pcVar7;
        if (pcVar7 == (char *)0x0) {
          iVar12 = 0xc;
        }
        else {
          *(undefined4 *)(puVar6 + 4) = 0;
          ppVar8 = Curl_thread_create(getaddrinfo_thread,(thread_sync_data *)(puVar6 + 3));
          *puVar6 = ppVar8;
          if (ppVar8 != (pthread_t *)0x0) {
            *local_40 = 1;
            return (Curl_addrinfo *)0x0;
          }
          *(undefined4 *)(puVar6 + 4) = 1;
          piVar9 = __errno_location();
          iVar12 = *piVar9;
        }
        destroy_async_data(async);
        goto LAB_0013a09b;
      }
    }
    destroy_thread_sync_data((thread_sync_data *)(puVar6 + 3));
    (conn->async).os_specific = (void *)0x0;
    (*Curl_cfree)(puVar6);
  }
LAB_0013a09b:
  piVar9 = __errno_location();
  *piVar9 = iVar12;
  Curl_failf(local_38,"getaddrinfo() thread failed to start\n");
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                         const char *hostname,
                                         int port,
                                         int *waitp)
{
  struct addrinfo hints;
  char sbuf[12];
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifndef USE_RESOLVE_ON_IPS
  {
    struct in_addr in;
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      return Curl_ip2addr(AF_INET, &in, hostname, port);
  }
#ifdef CURLRES_IPV6
  {
    struct in6_addr in6;
    /* check if this is an IPv6 address string */
    if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
      /* This is an IPv6 address literal */
      return Curl_ip2addr(AF_INET6, &in6, hostname, port);
  }
#endif /* CURLRES_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

  msnprintf(sbuf, sizeof(sbuf), "%d", port);

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}